

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_imgui.h
# Opt level: O0

void simgui_setup(simgui_desc_t *desc)

{
  bool bVar1;
  sg_vertex_attr_desc *attr_2;
  sg_vertex_attr_desc *attr_1;
  sg_vertex_attr_desc *attr;
  sg_pipeline_desc pip_desc;
  sg_shader_uniform_block_desc *ub;
  sg_shader_desc shd_desc;
  undefined1 local_7c8 [8];
  sg_image_desc img_desc;
  int font_height;
  int font_width;
  uchar *font_pixels;
  undefined1 local_118 [8];
  sg_buffer_desc ib_desc;
  undefined1 local_b0 [8];
  sg_buffer_desc vb_desc;
  ImGuiIO *io;
  simgui_desc_t *local_10;
  simgui_desc_t *desc_local;
  
  local_10 = desc;
  if (desc == (simgui_desc_t *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/util/sokol_imgui.h"
                  ,0x6cb,"void simgui_setup(const simgui_desc_t *)");
  }
  _simgui_clear(&_simgui,0x78);
  _simgui_desc_defaults((simgui_desc_t *)&io,local_10);
  memcpy(&_simgui,&io,0x38);
  _simgui.cur_dpi_scale = 1.0;
  _simgui.is_osx = _simgui_is_osx();
  if (0 < _simgui.desc.max_vertices) {
    _simgui.vertices.size = (long)_simgui.desc.max_vertices * 0x14;
    _simgui.vertices.ptr = _simgui_malloc(_simgui.vertices.size);
    _simgui.indices.size = (long)_simgui.desc.max_vertices * 6;
    _simgui.indices.ptr = _simgui_malloc(_simgui.indices.size);
    ImGui::CreateContext((ImFontAtlas *)0x0);
    ImGui::StyleColorsDark((ImGuiStyle *)0x0);
    vb_desc._88_8_ = ImGui::GetIO();
    if ((_simgui.desc.no_default_font & 1U) == 0) {
      ImFontAtlas::AddFontDefault(((ImGuiIO *)vb_desc._88_8_)->Fonts,(ImFontConfig *)0x0);
    }
    *(char **)(vb_desc._88_8_ + 0x18) = _simgui.desc.ini_filename;
    bVar1 = _simgui_is_osx();
    *(bool *)(vb_desc._88_8_ + 0x69) = bVar1;
    *(uint *)(vb_desc._88_8_ + 4) = *(uint *)(vb_desc._88_8_ + 4) | 8;
    if ((_simgui.desc.disable_set_mouse_cursor & 1U) == 0) {
      *(uint *)(vb_desc._88_8_ + 4) = *(uint *)(vb_desc._88_8_ + 4) | 2;
    }
    *(code **)(vb_desc._88_8_ + 0xa8) = _simgui_set_clipboard;
    *(code **)(vb_desc._88_8_ + 0xa0) = _simgui_get_clipboard;
    *(byte *)(vb_desc._88_8_ + 0x6d) = (_simgui.desc.disable_windows_resize_from_edges ^ 0xffU) & 1;
    sg_push_debug_group("sokol-imgui");
    _simgui_clear(local_b0,0x60);
    vb_desc.size._4_4_ = 3;
    vb_desc._0_8_ = _simgui.vertices.size;
    vb_desc.data.size = (size_t)anon_var_dwarf_e815;
    _simgui.vbuf = sg_make_buffer((sg_buffer_desc *)local_b0);
    ib_desc._92_4_ = _simgui.vbuf;
    _simgui_clear(local_118,0x60);
    ib_desc.size._0_4_ = 2;
    ib_desc.size._4_4_ = 3;
    ib_desc._0_8_ = _simgui.indices.size;
    ib_desc.data.size = (size_t)anon_var_dwarf_e82c;
    _simgui.ibuf = sg_make_buffer((sg_buffer_desc *)local_118);
    font_pixels._4_4_ = _simgui.ibuf;
    if ((_simgui.desc.no_default_font & 1U) == 0) {
      ImFontAtlas::GetTexDataAsRGBA32
                (*(ImFontAtlas **)(vb_desc._88_8_ + 0x48),(uchar **)&font_height,
                 (int *)&img_desc.field_0x694,(int *)&img_desc._end_canary,(int *)0x0);
      _simgui_clear(local_7c8,0x698);
      img_desc.type = img_desc._1684_4_;
      img_desc._8_4_ = img_desc._end_canary;
      img_desc.num_mipmaps = 0x17;
      img_desc.min_filter = SG_FILTER_LINEAR;
      img_desc.mag_filter = SG_FILTER_LINEAR;
      img_desc.pixel_format = SG_PIXELFORMAT_R8;
      img_desc.sample_count = 2;
      img_desc._72_8_ = _font_height;
      img_desc.data.subimage[0][0].ptr =
           (void *)((long)(int)(img_desc._1684_4_ * img_desc._end_canary) << 2);
      img_desc.data.subimage[5][0xf].size = (size_t)anon_var_dwarf_e843;
      shd_desc._3044_4_ = sg_make_image((sg_image_desc *)local_7c8);
      _simgui.img = (sg_image)shd_desc._3044_4_;
      *(ulong *)(*(long *)(vb_desc._88_8_ + 0x48) + 8) = (ulong)(uint)shd_desc._3044_4_;
    }
    _simgui_clear(&ub,0xbe8);
    shd_desc._0_8_ = (long)"Align label with current X position" + 0x1b;
    shd_desc.attrs[0]._16_8_ = anon_var_dwarf_e871;
    shd_desc.attrs[1]._16_8_ = anon_var_dwarf_e888;
    shd_desc.attrs[0].name = "TEXCOORD";
    shd_desc.attrs[0].sem_name._0_4_ = 0;
    shd_desc.attrs[1].name = "TEXCOORD";
    shd_desc.attrs[1].sem_name._0_4_ = 1;
    shd_desc.attrs[2].name = "TEXCOORD";
    shd_desc.attrs[2].sem_name._0_4_ = 2;
    shd_desc.vs.d3d11_target = (char *)0x10;
    shd_desc.vs.uniform_blocks[0]._8_8_ = anon_var_dwarf_e8aa;
    shd_desc.vs.uniform_blocks[0].uniforms[0].name._0_4_ = 4;
    shd_desc.vs.uniform_blocks[0].uniforms[0].name._4_4_ = 1;
    shd_desc.fs.uniform_blocks[3].uniforms[0xf]._8_8_ =
         (long)"(gl_shd_img->gl_tex_slot != -1) && gl_tex" + 0x26;
    shd_desc.fs.images[0].name._0_4_ = 1;
    shd_desc.fs.images[0].name._4_4_ = 1;
    shd_desc.fs.images[0xb]._8_8_ = anon_var_dwarf_e8cc;
    shd_desc.attrs[0xf]._16_8_ = _simgui_vs_source_glsl330;
    shd_desc.vs.images[0xb]._8_8_ = _simgui_fs_source_glsl330;
    _simgui.shd = sg_make_shader((sg_shader_desc *)&ub);
    pip_desc._564_4_ = _simgui.shd;
    _simgui_clear(&attr,0x238);
    pip_desc._start_canary = 0x14;
    pip_desc.layout.buffers[7].step_rate = 0;
    pip_desc.layout.attrs[0].buffer_index = 2;
    pip_desc.layout.attrs[0].format = SG_VERTEXFORMAT_UBYTE4N;
    pip_desc.layout.attrs[1].buffer_index = 2;
    pip_desc.layout.attrs[1].format = _SG_VERTEXFORMAT_NUM;
    pip_desc.layout.attrs[2].buffer_index = 8;
    attr._4_4_ = _simgui.shd.id;
    pip_desc.colors[3].blend.op_alpha = SG_BLENDOP_SUBTRACT;
    pip_desc.cull_mode = _simgui.desc.sample_count;
    pip_desc.layout.attrs[0xf].offset = _simgui.desc.depth_format;
    pip_desc.stencil.read_mask = (undefined1)_simgui.desc.color_format;
    pip_desc.stencil.write_mask = _simgui.desc.color_format._1_1_;
    pip_desc.stencil.ref = _simgui.desc.color_format._2_1_;
    pip_desc.stencil._39_1_ = _simgui.desc.color_format._3_1_;
    pip_desc.color_count = 7;
    if ((_simgui.desc.write_alpha_channel & 1U) != 0) {
      pip_desc.color_count = 0xf;
    }
    pip_desc.colors[0].pixel_format._0_1_ = SG_PIXELFORMAT_NONE;
    pip_desc.colors[0].write_mask = SG_COLORMASK_RB;
    pip_desc.colors[0].blend.enabled = true;
    pip_desc.colors[0].blend._1_3_ = 0;
    if ((_simgui.desc.write_alpha_channel & 1U) != 0) {
      pip_desc.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE;
      pip_desc.colors[0].blend.op_rgb = SG_BLENDOP_SUBTRACT;
    }
    pip_desc._544_8_ = anon_var_dwarf_e8e3;
    _simgui.pip = sg_make_pipeline((sg_pipeline_desc *)&attr);
    sg_pop_debug_group();
    return;
  }
  __assert_fail("_simgui.desc.max_vertices > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/util/sokol_imgui.h"
                ,0x6d7,"void simgui_setup(const simgui_desc_t *)");
}

Assistant:

SOKOL_API_IMPL void simgui_setup(const simgui_desc_t* desc) {
    SOKOL_ASSERT(desc);
    _simgui_clear(&_simgui, sizeof(_simgui));
    _simgui.desc = _simgui_desc_defaults(desc);
    _simgui.cur_dpi_scale = 1.0f;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
    _simgui.is_osx = _simgui_is_osx();
    #endif
    /* can keep color_format, depth_format and sample_count as is,
       since sokol_gfx.h will do its own default-value handling
    */

    /* allocate an intermediate vertex- and index-buffer */
    SOKOL_ASSERT(_simgui.desc.max_vertices > 0);
    _simgui.vertices.size = (size_t)_simgui.desc.max_vertices * sizeof(ImDrawVert);
    _simgui.vertices.ptr = _simgui_malloc(_simgui.vertices.size);
    _simgui.indices.size = (size_t)_simgui.desc.max_vertices * 3 * sizeof(ImDrawIdx);
    _simgui.indices.ptr = _simgui_malloc(_simgui.indices.size);

    /* initialize Dear ImGui */
    #if defined(__cplusplus)
        ImGui::CreateContext();
        ImGui::StyleColorsDark();
        ImGuiIO* io = &ImGui::GetIO();
        if (!_simgui.desc.no_default_font) {
            io->Fonts->AddFontDefault();
        }
    #else
        igCreateContext(NULL);
        igStyleColorsDark(igGetStyle());
        ImGuiIO* io = igGetIO();
        if (!_simgui.desc.no_default_font) {
            ImFontAtlas_AddFontDefault(io->Fonts, NULL);
        }
    #endif
    io->IniFilename = _simgui.desc.ini_filename;
    io->ConfigMacOSXBehaviors = _simgui_is_osx();
    io->BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset;
    #if !defined(SOKOL_IMGUI_NO_SOKOL_APP)
        if (!_simgui.desc.disable_set_mouse_cursor) {
            io->BackendFlags |= ImGuiBackendFlags_HasMouseCursors;
        }
        io->SetClipboardTextFn = _simgui_set_clipboard;
        io->GetClipboardTextFn = _simgui_get_clipboard;
    #endif
    io->ConfigWindowsResizeFromEdges = !_simgui.desc.disable_windows_resize_from_edges;

    /* create sokol-gfx resources */
    sg_push_debug_group("sokol-imgui");

    /* NOTE: since we're in C++ mode here we can't use C99 designated init */
    sg_buffer_desc vb_desc;
    _simgui_clear(&vb_desc, sizeof(vb_desc));
    vb_desc.usage = SG_USAGE_STREAM;
    vb_desc.size = _simgui.vertices.size;
    vb_desc.label = "sokol-imgui-vertices";
    _simgui.vbuf = sg_make_buffer(&vb_desc);

    sg_buffer_desc ib_desc;
    _simgui_clear(&ib_desc, sizeof(ib_desc));
    ib_desc.type = SG_BUFFERTYPE_INDEXBUFFER;
    ib_desc.usage = SG_USAGE_STREAM;
    ib_desc.size = _simgui.indices.size;
    ib_desc.label = "sokol-imgui-indices";
    _simgui.ibuf = sg_make_buffer(&ib_desc);

    /* default font texture */
    if (!_simgui.desc.no_default_font) {
        unsigned char* font_pixels;
        int font_width, font_height;
        #if defined(__cplusplus)
            io->Fonts->GetTexDataAsRGBA32(&font_pixels, &font_width, &font_height);
        #else
            int bytes_per_pixel;
            ImFontAtlas_GetTexDataAsRGBA32(io->Fonts, &font_pixels, &font_width, &font_height, &bytes_per_pixel);
        #endif
        sg_image_desc img_desc;
        _simgui_clear(&img_desc, sizeof(img_desc));
        img_desc.width = font_width;
        img_desc.height = font_height;
        img_desc.pixel_format = SG_PIXELFORMAT_RGBA8;
        img_desc.wrap_u = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.wrap_v = SG_WRAP_CLAMP_TO_EDGE;
        img_desc.min_filter = SG_FILTER_LINEAR;
        img_desc.mag_filter = SG_FILTER_LINEAR;
        img_desc.data.subimage[0][0].ptr = font_pixels;
        img_desc.data.subimage[0][0].size = (size_t)(font_width * font_height) * sizeof(uint32_t);
        img_desc.label = "sokol-imgui-font";
        _simgui.img = sg_make_image(&img_desc);
        io->Fonts->TexID = (ImTextureID)(uintptr_t) _simgui.img.id;
    }

    /* shader object for using the embedded shader source (or bytecode) */
    sg_shader_desc shd_desc;
    _simgui_clear(&shd_desc, sizeof(shd_desc));
    shd_desc.attrs[0].name = "position";
    shd_desc.attrs[1].name = "texcoord0";
    shd_desc.attrs[2].name = "color0";
    shd_desc.attrs[0].sem_name = "TEXCOORD";
    shd_desc.attrs[0].sem_index = 0;
    shd_desc.attrs[1].sem_name = "TEXCOORD";
    shd_desc.attrs[1].sem_index = 1;
    shd_desc.attrs[2].sem_name = "TEXCOORD";
    shd_desc.attrs[2].sem_index = 2;
    sg_shader_uniform_block_desc* ub = &shd_desc.vs.uniform_blocks[0];
    ub->size = sizeof(_simgui_vs_params_t);
    ub->uniforms[0].name = "vs_params";
    ub->uniforms[0].type = SG_UNIFORMTYPE_FLOAT4;
    ub->uniforms[0].array_count = 1;
    shd_desc.fs.images[0].name = "tex";
    shd_desc.fs.images[0].image_type = SG_IMAGETYPE_2D;
    shd_desc.fs.images[0].sampler_type = SG_SAMPLERTYPE_FLOAT;
    shd_desc.label = "sokol-imgui-shader";
    #if defined(SOKOL_GLCORE33)
        shd_desc.vs.source = _simgui_vs_source_glsl330;
        shd_desc.fs.source = _simgui_fs_source_glsl330;
    #elif defined(SOKOL_GLES2) || defined(SOKOL_GLES3)
        shd_desc.vs.source = _simgui_vs_source_glsl100;
        shd_desc.fs.source = _simgui_fs_source_glsl100;
    #elif defined(SOKOL_METAL)
        shd_desc.vs.entry = "main0";
        shd_desc.fs.entry = "main0";
        switch (sg_query_backend()) {
            case SG_BACKEND_METAL_MACOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_macos);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_macos);
                break;
            case SG_BACKEND_METAL_IOS:
                shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_metal_ios);
                shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_metal_ios);
                break;
            default:
                shd_desc.vs.source = _simgui_vs_source_metal_sim;
                shd_desc.fs.source = _simgui_fs_source_metal_sim;
                break;
        }
    #elif defined(SOKOL_D3D11)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_hlsl4);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_hlsl4);
    #elif defined(SOKOL_WGPU)
        shd_desc.vs.bytecode = SG_RANGE(_simgui_vs_bytecode_wgpu);
        shd_desc.fs.bytecode = SG_RANGE(_simgui_fs_bytecode_wgpu);
    #else
        shd_desc.vs.source = _simgui_vs_source_dummy;
        shd_desc.fs.source = _simgui_fs_source_dummy;
    #endif
    _simgui.shd = sg_make_shader(&shd_desc);

    /* pipeline object for imgui rendering */
    sg_pipeline_desc pip_desc;
    _simgui_clear(&pip_desc, sizeof(pip_desc));
    pip_desc.layout.buffers[0].stride = sizeof(ImDrawVert);
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[0];
        attr->offset = offsetof(ImDrawVert, pos);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[1];
        attr->offset = offsetof(ImDrawVert, uv);
        attr->format = SG_VERTEXFORMAT_FLOAT2;
    }
    {
        sg_vertex_attr_desc* attr = &pip_desc.layout.attrs[2];
        attr->offset = offsetof(ImDrawVert, col);
        attr->format = SG_VERTEXFORMAT_UBYTE4N;
    }
    pip_desc.shader = _simgui.shd;
    pip_desc.index_type = SG_INDEXTYPE_UINT16;
    pip_desc.sample_count = _simgui.desc.sample_count;
    pip_desc.depth.pixel_format = _simgui.desc.depth_format;
    pip_desc.colors[0].pixel_format = _simgui.desc.color_format;
    pip_desc.colors[0].write_mask = _simgui.desc.write_alpha_channel ? SG_COLORMASK_RGBA : SG_COLORMASK_RGB;
    pip_desc.colors[0].blend.enabled = true;
    pip_desc.colors[0].blend.src_factor_rgb = SG_BLENDFACTOR_SRC_ALPHA;
    pip_desc.colors[0].blend.dst_factor_rgb = SG_BLENDFACTOR_ONE_MINUS_SRC_ALPHA;
    if (_simgui.desc.write_alpha_channel) {
        pip_desc.colors[0].blend.src_factor_alpha = SG_BLENDFACTOR_ONE;
        pip_desc.colors[0].blend.dst_factor_alpha = SG_BLENDFACTOR_ONE;
    }
    pip_desc.label = "sokol-imgui-pipeline";
    _simgui.pip = sg_make_pipeline(&pip_desc);

    sg_pop_debug_group();
}